

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnSetBool(XL *out,char *key,bool value)

{
  XLearn *this;
  bool bVar1;
  int iVar2;
  HyperParam *pHVar3;
  byte in_DL;
  char *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  bVar1 = (bool)(in_DL & 1);
  this = (XLearn *)*in_RDI;
  iVar2 = strcmp(in_RSI,"on_disk");
  if (iVar2 == 0) {
    pHVar3 = XLearn::GetHyperParam(this);
    pHVar3->on_disk = bVar1;
  }
  else {
    iVar2 = strcmp(in_RSI,"quiet");
    if (iVar2 == 0) {
      pHVar3 = XLearn::GetHyperParam(this);
      pHVar3->quiet = bVar1;
    }
    else {
      iVar2 = strcmp(in_RSI,"norm");
      if (iVar2 == 0) {
        pHVar3 = XLearn::GetHyperParam(this);
        pHVar3->norm = bVar1;
      }
      else {
        iVar2 = strcmp(in_RSI,"lock_free");
        if (iVar2 == 0) {
          pHVar3 = XLearn::GetHyperParam(this);
          pHVar3->lock_free = bVar1;
        }
        else {
          iVar2 = strcmp(in_RSI,"early_stop");
          if (iVar2 == 0) {
            pHVar3 = XLearn::GetHyperParam(this);
            pHVar3->early_stop = bVar1;
          }
          else {
            iVar2 = strcmp(in_RSI,"sign");
            if (iVar2 == 0) {
              pHVar3 = XLearn::GetHyperParam(this);
              pHVar3->sign = bVar1;
            }
            else {
              iVar2 = strcmp(in_RSI,"sigmoid");
              if (iVar2 == 0) {
                pHVar3 = XLearn::GetHyperParam(this);
                pHVar3->sigmoid = bVar1;
              }
              else {
                iVar2 = strcmp(in_RSI,"bin_out");
                if (iVar2 == 0) {
                  pHVar3 = XLearn::GetHyperParam(this);
                  pHVar3->bin_out = bVar1;
                }
                else {
                  iVar2 = strcmp(in_RSI,"from_file");
                  if (iVar2 == 0) {
                    pHVar3 = XLearn::GetHyperParam(this);
                    pHVar3->from_file = bVar1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnSetBool(XL *out, const char *key, const bool value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "on_disk") == 0) {
    xl->GetHyperParam().on_disk = value;
  } else if (strcmp(key, "quiet") == 0) {
    xl->GetHyperParam().quiet = value;
  } else if (strcmp(key, "norm") == 0) {
    xl->GetHyperParam().norm = value;
  } else if (strcmp(key, "lock_free") == 0) {
    xl->GetHyperParam().lock_free = value;
  } else if (strcmp(key, "early_stop") == 0) {
    xl->GetHyperParam().early_stop = value;
  } else if (strcmp(key, "sign") == 0) {
    xl->GetHyperParam().sign = value;
  } else if (strcmp(key, "sigmoid") == 0) {
    xl->GetHyperParam().sigmoid = value;
  } else if (strcmp(key, "bin_out") == 0) {
    xl->GetHyperParam().bin_out = value;
  } else if (strcmp(key, "from_file") == 0) {
    xl->GetHyperParam().from_file = value;
  }
  API_END();
}